

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::GenerateImportFile(cmGlobalGenerator *this,string *file)

{
  cmMakefile *this_00;
  bool bVar1;
  pointer ppVar2;
  reference ppcVar3;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_50;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_48;
  __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_40;
  const_iterator mit;
  iterator iStack_30;
  bool result;
  _Self local_28;
  iterator it;
  string *file_local;
  cmGlobalGenerator *this_local;
  
  it._M_node = (_Base_ptr)file;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
       ::find(&this->BuildExportSets,file);
  iStack_30 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
              ::end(&this->BuildExportSets);
  bVar1 = std::operator!=(&local_28,&stack0xffffffffffffffd0);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
             ::operator->(&local_28);
    mit._M_current._7_1_ =
         cmExportFileGenerator::GenerateImportFile(&ppVar2->second->super_cmExportFileGenerator);
    if ((this->ConfigureDoneCMP0026AndCMP0024 & 1U) == 0) {
      local_48._M_current =
           (cmMakefile **)
           std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin(&this->Makefiles);
      __gnu_cxx::
      __normal_iterator<cmMakefile*const*,std::vector<cmMakefile*,std::allocator<cmMakefile*>>>::
      __normal_iterator<cmMakefile**>
                ((__normal_iterator<cmMakefile*const*,std::vector<cmMakefile*,std::allocator<cmMakefile*>>>
                  *)&local_40,&local_48);
      while( true ) {
        local_50._M_current =
             (cmMakefile **)
             std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end(&this->Makefiles);
        bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
        if (!bVar1) break;
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                  ::operator*(&local_40);
        this_00 = *ppcVar3;
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
                 ::operator->(&local_28);
        cmMakefile::RemoveExportBuildFileGeneratorCMP0024(this_00,ppVar2->second);
        __gnu_cxx::
        __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
        ::operator++(&local_40);
      }
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
             ::operator->(&local_28);
    if (ppVar2->second != (cmExportBuildFileGenerator *)0x0) {
      (*(ppVar2->second->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[1])();
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
             ::operator->(&local_28);
    ppVar2->second = (cmExportBuildFileGenerator *)0x0;
    std::
    map<std::__cxx11::string,cmExportBuildFileGenerator*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,cmExportBuildFileGenerator*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>>
                        *)&this->BuildExportSets,(iterator)local_28._M_node);
    this_local._7_1_ = (bool)(mit._M_current._7_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::GenerateImportFile(const std::string &file)
{
  std::map<std::string, cmExportBuildFileGenerator*>::iterator it
                                          = this->BuildExportSets.find(file);
  if (it != this->BuildExportSets.end())
    {
    bool result = it->second->GenerateImportFile();

    if (!this->ConfigureDoneCMP0026AndCMP0024)
      {
      for (std::vector<cmMakefile*>::const_iterator mit =
           this->Makefiles.begin(); mit != this->Makefiles.end(); ++mit)
        {
        (*mit)->RemoveExportBuildFileGeneratorCMP0024(it->second);
        }
      }

    delete it->second;
    it->second = 0;
    this->BuildExportSets.erase(it);
    return result;
    }
  return false;
}